

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexicon.cpp
# Opt level: O0

void __thiscall Lexico::AnalisadorLexico(Lexico *this)

{
  bool bVar1;
  int qnt;
  long *plVar2;
  size_type sVar3;
  reference pvVar4;
  string local_298;
  string local_278 [8];
  string palavra;
  int indice_caracter;
  int final_state;
  int current_state;
  int local_238;
  int j;
  int i;
  char ch;
  vector<char,_std::allocator<char>_> caracter;
  ifstream fin;
  Lexico *this_local;
  
  std::ifstream::ifstream
            (&caracter.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
             "/media/augusto/Augusto/Documentos/Codigos/simple-parser/test.txt",_S_in);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&i);
  while( true ) {
    plVar2 = (long *)std::istream::get(&caracter.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.field_0x10);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    if (!bVar1) break;
    std::vector<char,_std::allocator<char>_>::push_back
              ((vector<char,_std::allocator<char>_> *)&i,(value_type *)((long)&j + 3));
  }
  std::ios::clear(&caracter.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 +
                  *(long *)(caracter.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_
                           + -0x18),0);
  std::ifstream::close();
  indice_caracter = 1;
  palavra.field_2._12_4_ = 0;
  std::__cxx11::string::string(local_278);
  local_238 = 0;
  while( true ) {
    sVar3 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)&i);
    if (sVar3 <= (ulong)(long)local_238) {
      Token(this,palavra.field_2._12_4_);
      Tokens::Inverter(&this->super_Tokens);
      std::__cxx11::string::~string(local_278);
      std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&i);
      std::ifstream::~ifstream
                (&caracter.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      return;
    }
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)&i,(long)local_238);
    palavra.field_2._8_4_ = PosicaoIndice(this,*pvVar4);
    if ((palavra.field_2._8_4_ == -1) && (indice_caracter != 1)) {
      indice_caracter = 0;
    }
    if ((palavra.field_2._8_4_ == -1) && (indice_caracter == 1)) {
      indice_caracter = 0x3c;
    }
    if (palavra.field_2._8_4_ != -1) {
      indice_caracter = this->automato[indice_caracter][(int)palavra.field_2._8_4_];
    }
    bVar1 = isFinal(this,indice_caracter);
    if (bVar1) {
      palavra.field_2._12_4_ = indice_caracter;
    }
    if (indice_caracter != 0) {
      if (indice_caracter == 2) {
        std::vector<char,_std::allocator<char>_>::operator[]
                  ((vector<char,_std::allocator<char>_> *)&i,(long)local_238);
        std::__cxx11::string::push_back((char)local_278);
      }
      local_238 = local_238 + 1;
    }
    if (indice_caracter == 0x3c) break;
    if (indice_caracter == 0) {
      if ((palavra.field_2._12_4_ == 2) || (palavra.field_2._12_4_ == 0x2c)) {
        std::__cxx11::string::string((string *)&local_298,local_278);
        bVar1 = Tokens::IsReservada(&this->super_Tokens,&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        if (!bVar1) {
          qnt = std::__cxx11::string::size();
          Tokens::setToken(&this->super_Tokens,2,qnt);
        }
        std::__cxx11::string::clear();
      }
      else {
        Token(this,palavra.field_2._12_4_);
      }
      indice_caracter = 1;
      palavra.field_2._12_4_ = 0;
    }
  }
  std::operator<<((ostream *)&std::cout,"\nExpected caracter valid!!\n\n");
  exit(0);
}

Assistant:

void Lexico::AnalisadorLexico() {
  ifstream fin ("/media/augusto/Augusto/Documentos/Codigos/simple-parser/test.txt", ifstream::in);
  vector<char> caracter;
  char ch;
  int i, j;

  while (fin.get(ch)) {
    caracter.push_back(ch);
  }

  fin.clear();
  fin.close();
  int current_state = 1;
  int final_state = 0;
  int indice_caracter;
  string palavra;
  i = j = 0;
  while (i < caracter.size()) {
    indice_caracter = PosicaoIndice(caracter[i]);
    // cout << " " << caracter[i] << " | " << current_state << " -> " << indice_caracter << "\n";
    if (indice_caracter == -1 && current_state != 1) current_state = 0;
    if (indice_caracter == -1 && current_state == 1) current_state = estado_erro;
    if (indice_caracter != -1) current_state = automato[current_state][indice_caracter];

    if (isFinal(current_state)) final_state = current_state;

        // cout << caracter[i];
    if (current_state != 0) {
      if (current_state == 2 ) {
       palavra.push_back(caracter[i]);
      }
      i++;
    }
    if (current_state == estado_erro) {
      cout << "\nExpected caracter valid!!\n\n";
      exit(0);
    }
    if (current_state == 0) {
      if (final_state == 2 || final_state == UNDER) {
        // cout << "palavra: " << palavra << "\n";
        if (Tokens::IsReservada(palavra));
        else Tokens::setToken(2, palavra.size());
        palavra.clear();
      }
      else Token(final_state);
      current_state = 1;
      final_state = 0;
    }
  }
  Token (final_state);
  Inverter();
}